

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArchiveWrite.cxx
# Opt level: O0

bool __thiscall cmArchiveWrite::AddFile(cmArchiveWrite *this,char *file,size_t skip,char *prefix)

{
  archive *paVar1;
  uint uVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  mode_t p;
  uint uVar6;
  size_t sVar7;
  ostream *poVar8;
  archive_entry *paVar9;
  ulong uVar10;
  char *pcVar11;
  size_t sVar12;
  char *local_350;
  size_t size;
  string local_310;
  uint local_2ec;
  time_t tStack_2e8;
  int perm;
  time_t epochTime;
  istringstream iss;
  undefined1 local_160 [8];
  string source_date_epoch;
  string local_138;
  time_t local_118;
  time_t t;
  time_t now;
  string local_100;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  Entry local_98;
  Entry e;
  char *local_80;
  undefined1 local_78 [8];
  string dest;
  cmLocaleRAII localeRAII;
  char *out;
  char *prefix_local;
  size_t skip_local;
  char *file_local;
  cmArchiveWrite *this_local;
  
  skip_local = (size_t)file;
  file_local = (char *)this;
  std::__cxx11::string::operator=((string *)&this->Error,"");
  sVar7 = strlen((char *)skip_local);
  if (sVar7 <= skip) {
    this_local._7_1_ = 1;
    goto LAB_00145cae;
  }
  localeRAII.OldLocale.field_2._8_8_ = skip_local + skip;
  cmLocaleRAII::cmLocaleRAII((cmLocaleRAII *)((long)&dest.field_2 + 8));
  local_350 = prefix;
  if (prefix == (char *)0x0) {
    local_350 = "";
  }
  local_80 = local_350;
  cmStrCat<char_const*,char_const*&>
            ((string *)local_78,&local_80,(char **)((long)&localeRAII.OldLocale.field_2 + 8));
  if ((this->Verbose & 1U) != 0) {
    poVar8 = std::operator<<((ostream *)&std::cout,(string *)local_78);
    std::operator<<(poVar8,"\n");
  }
  Entry::Entry(&local_98);
  paVar9 = Entry::operator_cast_to_archive_entry_(&local_98);
  sVar12 = skip_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,(char *)sVar12,&local_b9);
  cm_archive_entry_copy_sourcepath(paVar9,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  paVar9 = Entry::operator_cast_to_archive_entry_(&local_98);
  cm_archive_entry_copy_pathname(paVar9,(string *)local_78);
  paVar1 = this->Disk;
  paVar9 = Entry::operator_cast_to_archive_entry_(&local_98);
  iVar5 = archive_read_disk_entry_from_file(paVar1,paVar9,-1,(stat *)0x0);
  if (iVar5 == 0) {
    uVar10 = std::__cxx11::string::empty();
    if ((uVar10 & 1) == 0) {
      time(&t);
      pcVar11 = (char *)std::__cxx11::string::c_str();
      local_118 = cm_get_date(t,pcVar11);
      if (local_118 == -1) {
        source_date_epoch.field_2._M_local_buf[0xf] = '\'';
        cmStrCat<char_const(&)[24],std::__cxx11::string&,char>
                  (&local_138,(char (*) [24])"unable to parse mtime \'",&this->MTime,
                   source_date_epoch.field_2._M_local_buf + 0xf);
        std::__cxx11::string::operator=((string *)&this->Error,(string *)&local_138);
        std::__cxx11::string::~string((string *)&local_138);
        this_local._7_1_ = false;
        goto LAB_00145c6e;
      }
      paVar9 = Entry::operator_cast_to_archive_entry_(&local_98);
      archive_entry_set_mtime(paVar9,local_118,0);
    }
    else {
      std::__cxx11::string::string((string *)local_160);
      cmsys::SystemTools::GetEnv("SOURCE_DATE_EPOCH",(string *)local_160);
      uVar10 = std::__cxx11::string::empty();
      if ((uVar10 & 1) == 0) {
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)&epochTime,(string *)local_160,_S_in);
        std::istream::operator>>((istream *)&epochTime,&stack0xfffffffffffffd18);
        bVar3 = std::ios::eof();
        if (((bVar3 & 1) != 0) && (bVar3 = std::ios::fail(), (bVar3 & 1) == 0)) {
          paVar9 = Entry::operator_cast_to_archive_entry_(&local_98);
          archive_entry_set_mtime(paVar9,tStack_2e8,0);
          paVar9 = Entry::operator_cast_to_archive_entry_(&local_98);
          archive_entry_set_atime(paVar9,tStack_2e8,0);
          paVar9 = Entry::operator_cast_to_archive_entry_(&local_98);
          archive_entry_set_ctime(paVar9,tStack_2e8,0);
          paVar9 = Entry::operator_cast_to_archive_entry_(&local_98);
          archive_entry_set_birthtime(paVar9,tStack_2e8,0);
        }
        std::__cxx11::istringstream::~istringstream((istringstream *)&epochTime);
      }
      std::__cxx11::string::~string((string *)local_160);
    }
    bVar4 = cmArchiveWriteOptional<int>::IsSet(&this->Uid);
    if ((bVar4) && (bVar4 = cmArchiveWriteOptional<int>::IsSet(&this->Gid), bVar4)) {
      paVar9 = Entry::operator_cast_to_archive_entry_(&local_98);
      iVar5 = cmArchiveWriteOptional<int>::Get(&this->Uid);
      archive_entry_set_uid(paVar9,(long)iVar5);
      paVar9 = Entry::operator_cast_to_archive_entry_(&local_98);
      iVar5 = cmArchiveWriteOptional<int>::Get(&this->Gid);
      archive_entry_set_gid(paVar9,(long)iVar5);
    }
    uVar10 = std::__cxx11::string::empty();
    if (((uVar10 & 1) == 0) && (uVar10 = std::__cxx11::string::empty(), (uVar10 & 1) == 0)) {
      paVar9 = Entry::operator_cast_to_archive_entry_(&local_98);
      pcVar11 = (char *)std::__cxx11::string::c_str();
      archive_entry_set_uname(paVar9,pcVar11);
      paVar9 = Entry::operator_cast_to_archive_entry_(&local_98);
      pcVar11 = (char *)std::__cxx11::string::c_str();
      archive_entry_set_gname(paVar9,pcVar11);
    }
    bVar4 = cmArchiveWriteOptional<int>::IsSet(&this->Permissions);
    if (bVar4) {
      paVar9 = Entry::operator_cast_to_archive_entry_(&local_98);
      p = cmArchiveWriteOptional<int>::Get(&this->Permissions);
      archive_entry_set_perm(paVar9,p);
    }
    bVar4 = cmArchiveWriteOptional<int>::IsSet(&this->PermissionsMask);
    if (bVar4) {
      paVar9 = Entry::operator_cast_to_archive_entry_(&local_98);
      local_2ec = archive_entry_perm(paVar9);
      paVar9 = Entry::operator_cast_to_archive_entry_(&local_98);
      uVar2 = local_2ec;
      uVar6 = cmArchiveWriteOptional<int>::Get(&this->PermissionsMask);
      archive_entry_set_perm(paVar9,uVar2 & uVar6);
    }
    paVar9 = Entry::operator_cast_to_archive_entry_(&local_98);
    archive_entry_acl_clear(paVar9);
    paVar9 = Entry::operator_cast_to_archive_entry_(&local_98);
    archive_entry_xattr_clear(paVar9);
    paVar9 = Entry::operator_cast_to_archive_entry_(&local_98);
    archive_entry_set_fflags(paVar9,0,0);
    bVar4 = std::operator==(&this->Format,"pax");
    if ((bVar4) || (bVar4 = std::operator==(&this->Format,"paxr"), bVar4)) {
      paVar9 = Entry::operator_cast_to_archive_entry_(&local_98);
      archive_entry_sparse_clear(paVar9);
    }
    paVar1 = this->Archive;
    paVar9 = Entry::operator_cast_to_archive_entry_(&local_98);
    iVar5 = archive_write_header(paVar1,paVar9);
    if (iVar5 == 0) {
      paVar9 = Entry::operator_cast_to_archive_entry_(&local_98);
      pcVar11 = archive_entry_symlink(paVar9);
      if (pcVar11 == (char *)0x0) {
        paVar9 = Entry::operator_cast_to_archive_entry_(&local_98);
        sVar12 = archive_entry_size(paVar9);
        if (sVar12 != 0) {
          this_local._7_1_ = AddData(this,(char *)skip_local,sVar12);
          goto LAB_00145c6e;
        }
      }
      this_local._7_1_ = true;
    }
    else {
      cm_archive_error_string_abi_cxx11_((string *)&size,this->Archive);
      cmStrCat<char_const(&)[23],std::__cxx11::string>
                (&local_310,(char (*) [23])"archive_write_header: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&size);
      std::__cxx11::string::operator=((string *)&this->Error,(string *)&local_310);
      std::__cxx11::string::~string((string *)&local_310);
      std::__cxx11::string::~string((string *)&size);
      this_local._7_1_ = false;
    }
  }
  else {
    cm_archive_error_string_abi_cxx11_(&local_100,this->Disk);
    cmStrCat<char_const(&)[27],char_const*&,char_const(&)[4],std::__cxx11::string>
              (&local_e0,(char (*) [27])"Unable to read from file \'",(char **)&skip_local,
               (char (*) [4])"\': ",&local_100);
    std::__cxx11::string::operator=((string *)&this->Error,(string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    this_local._7_1_ = false;
  }
LAB_00145c6e:
  now._4_4_ = 1;
  Entry::~Entry(&local_98);
  std::__cxx11::string::~string((string *)local_78);
  cmLocaleRAII::~cmLocaleRAII((cmLocaleRAII *)((long)&dest.field_2 + 8));
LAB_00145cae:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmArchiveWrite::AddFile(const char* file, size_t skip, const char* prefix)
{
  this->Error = "";
  // Skip the file if we have no name for it.  This may happen on a
  // top-level directory, which does not need to be included anyway.
  if (skip >= strlen(file)) {
    return true;
  }
  const char* out = file + skip;

  cmLocaleRAII localeRAII;
  static_cast<void>(localeRAII);

  // Meta-data.
  std::string dest = cmStrCat(prefix ? prefix : "", out);
  if (this->Verbose) {
    std::cout << dest << "\n";
  }
  Entry e;
  cm_archive_entry_copy_sourcepath(e, file);
  cm_archive_entry_copy_pathname(e, dest);
  if (archive_read_disk_entry_from_file(this->Disk, e, -1, nullptr) !=
      ARCHIVE_OK) {
    this->Error = cmStrCat("Unable to read from file '", file,
                           "': ", cm_archive_error_string(this->Disk));
    return false;
  }
  if (!this->MTime.empty()) {
    time_t now;
    time(&now);
    time_t t = cm_get_date(now, this->MTime.c_str());
    if (t == -1) {
      this->Error = cmStrCat("unable to parse mtime '", this->MTime, '\'');
      return false;
    }
    archive_entry_set_mtime(e, t, 0);
  } else {
    std::string source_date_epoch;
    cmSystemTools::GetEnv("SOURCE_DATE_EPOCH", source_date_epoch);
    if (!source_date_epoch.empty()) {
      std::istringstream iss(source_date_epoch);
      time_t epochTime;
      iss >> epochTime;
      if (iss.eof() && !iss.fail()) {
        // Set all of the file times to the epoch time to handle archive
        // formats that include creation/access time.
        archive_entry_set_mtime(e, epochTime, 0);
        archive_entry_set_atime(e, epochTime, 0);
        archive_entry_set_ctime(e, epochTime, 0);
        archive_entry_set_birthtime(e, epochTime, 0);
      }
    }
  }

  // manages the uid/guid of the entry (if any)
  if (this->Uid.IsSet() && this->Gid.IsSet()) {
    archive_entry_set_uid(e, this->Uid.Get());
    archive_entry_set_gid(e, this->Gid.Get());
  }

  if (!this->Uname.empty() && !this->Gname.empty()) {
    archive_entry_set_uname(e, this->Uname.c_str());
    archive_entry_set_gname(e, this->Gname.c_str());
  }

  // manages the permissions
  if (this->Permissions.IsSet()) {
    archive_entry_set_perm(e, this->Permissions.Get());
  }

  if (this->PermissionsMask.IsSet()) {
    int perm = archive_entry_perm(e);
    archive_entry_set_perm(e, perm & this->PermissionsMask.Get());
  }

  // Clear acl and xattr fields not useful for distribution.
  archive_entry_acl_clear(e);
  archive_entry_xattr_clear(e);
  archive_entry_set_fflags(e, 0, 0);

  if (this->Format == "pax" || this->Format == "paxr") {
    // Sparse files are a GNU tar extension.
    // Do not use them in standard tar files.
    archive_entry_sparse_clear(e);
  }

  if (archive_write_header(this->Archive, e) != ARCHIVE_OK) {
    this->Error = cmStrCat("archive_write_header: ",
                           cm_archive_error_string(this->Archive));
    return false;
  }

  // do not copy content of symlink
  if (!archive_entry_symlink(e)) {
    // Content.
    if (size_t size = static_cast<size_t>(archive_entry_size(e))) {
      return this->AddData(file, size);
    }
  }
  return true;
}